

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.h
# Opt level: O1

string * __thiscall
flatbuffers::GetAnyFieldS_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,Table *table,Field *field,Schema *schema
          )

{
  ushort uVar1;
  Table *pTVar2;
  flatbuffers *this_00;
  ushort uVar3;
  long lVar4;
  Schema *schema_00;
  Table *pTVar5;
  ushort uVar6;
  
  lVar4 = -(long)*(int *)table;
  uVar3 = *(ushort *)(table + -(long)*(int *)table);
  if (uVar3 < 0xb) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(table + lVar4 + 10);
  }
  if (uVar1 == 0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(ushort *)(table + uVar1);
  }
  if (uVar1 < *(ushort *)(this + -(long)*(int *)this)) {
    uVar1 = *(ushort *)(this + ((ulong)uVar1 - (long)*(int *)this));
  }
  else {
    uVar1 = 0;
  }
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    if (uVar3 < 7) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ushort *)(table + lVar4 + 6);
    }
    if (uVar6 == 0) {
      pTVar5 = (Table *)0x0;
    }
    else {
      pTVar5 = table + (ulong)*(uint *)(table + uVar6) + (ulong)uVar6;
    }
    this_00 = (flatbuffers *)0x0;
    uVar6 = 0;
    if (4 < *(ushort *)(pTVar5 + -(long)*(int *)pTVar5)) {
      uVar6 = *(ushort *)(pTVar5 + (4 - (long)*(int *)pTVar5));
    }
    if (uVar6 != 0) {
      this_00 = (flatbuffers *)(ulong)(uint)(int)(char)pTVar5[uVar6];
    }
    if (uVar3 < 7) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(table + lVar4 + 6);
    }
    if (uVar3 == 0) {
      pTVar2 = (Table *)0x0;
    }
    else {
      pTVar2 = table + (ulong)*(uint *)(table + uVar3) + (ulong)uVar3;
    }
    if (*(ushort *)(pTVar2 + -(long)*(int *)pTVar2) < 9) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(ushort *)(pTVar2 + (8 - (long)*(int *)pTVar2));
    }
    if (uVar3 == 0) {
      schema_00 = (Schema *)0xffffffff;
    }
    else {
      schema_00 = (Schema *)(ulong)*(uint *)(pTVar2 + uVar3);
    }
    GetAnyValueS_abi_cxx11_
              (__return_storage_ptr__,this_00,(int)this + (uint)uVar1,(uint8_t *)field,schema_00,
               (int)pTVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string GetAnyFieldS(const Table &table,
                                const reflection::Field &field,
                                const reflection::Schema *schema) {
  auto field_ptr = table.GetAddressOf(field.offset());
  return field_ptr ? GetAnyValueS(field.type()->base_type(), field_ptr, schema,
                                  field.type()->index())
                   : "";
}